

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

uint32_t net_uv::net_getsockAddrIPAndPort(sockaddr *addr,string *outIP,uint32_t *outPort)

{
  int iVar1;
  uint32_t uVar2;
  ushort uVar3;
  string strip;
  char szIp [47];
  
  if (addr == (sockaddr *)0x0) {
    return 0;
  }
  strip._M_dataplus._M_p = (pointer)&strip.field_2;
  strip._M_string_length = 0;
  strip.field_2._M_local_buf[0] = '\0';
  if (addr->sa_family == 10) {
    szIp[0x20] = '\0';
    szIp[0x21] = '\0';
    szIp[0x22] = '\0';
    szIp[0x23] = '\0';
    szIp[0x24] = '\0';
    szIp[0x25] = '\0';
    szIp[0x26] = '\0';
    szIp[0x27] = '\0';
    szIp[0x28] = '\0';
    szIp[0x29] = '\0';
    szIp[0x2a] = '\0';
    szIp[0x2b] = '\0';
    szIp[0x2c] = '\0';
    szIp[0x2d] = '\0';
    szIp[0x2e] = '\0';
    szIp[0x10] = '\0';
    szIp[0x11] = '\0';
    szIp[0x12] = '\0';
    szIp[0x13] = '\0';
    szIp[0x14] = '\0';
    szIp[0x15] = '\0';
    szIp[0x16] = '\0';
    szIp[0x17] = '\0';
    szIp[0x18] = '\0';
    szIp[0x19] = '\0';
    szIp[0x1a] = '\0';
    szIp[0x1b] = '\0';
    szIp[0x1c] = '\0';
    szIp[0x1d] = '\0';
    szIp[0x1e] = '\0';
    szIp[0x1f] = '\0';
    szIp[0] = '\0';
    szIp[1] = '\0';
    szIp[2] = '\0';
    szIp[3] = '\0';
    szIp[4] = '\0';
    szIp[5] = '\0';
    szIp[6] = '\0';
    szIp[7] = '\0';
    szIp[8] = '\0';
    szIp[9] = '\0';
    szIp[10] = '\0';
    szIp[0xb] = '\0';
    szIp[0xc] = '\0';
    szIp[0xd] = '\0';
    szIp[0xe] = '\0';
    szIp[0xf] = '\0';
    iVar1 = uv_ip6_name((sockaddr_in6 *)addr,szIp,0x2e);
    if (iVar1 == 0) {
      std::__cxx11::string::assign((char *)&strip);
      uVar3 = *(ushort *)addr->sa_data << 8 | *(ushort *)addr->sa_data >> 8;
      uVar2 = 0x1c;
LAB_0010fa80:
      std::__cxx11::string::_M_assign((string *)outIP);
      *outPort = (uint)uVar3;
      goto LAB_0010fa92;
    }
  }
  else {
    szIp[0] = '\0';
    szIp[1] = '\0';
    szIp[2] = '\0';
    szIp[3] = '\0';
    szIp[4] = '\0';
    szIp[5] = '\0';
    szIp[6] = '\0';
    szIp[7] = '\0';
    szIp[8] = '\0';
    szIp[9] = '\0';
    szIp[10] = '\0';
    szIp[0xb] = '\0';
    szIp[0xc] = '\0';
    szIp[0xd] = '\0';
    szIp[0xe] = '\0';
    szIp[0xf] = '\0';
    szIp._16_8_ = szIp._16_8_ & 0xffffffffffffff00;
    iVar1 = uv_ip4_name((sockaddr_in *)addr,szIp,0x10);
    if (iVar1 == 0) {
      std::__cxx11::string::assign((char *)&strip);
      uVar3 = *(ushort *)addr->sa_data << 8 | *(ushort *)addr->sa_data >> 8;
      uVar2 = 0x10;
      goto LAB_0010fa80;
    }
  }
  uVar2 = 0;
LAB_0010fa92:
  std::__cxx11::string::~string((string *)&strip);
  return uVar2;
}

Assistant:

uint32_t net_getsockAddrIPAndPort(const struct sockaddr* addr, std::string& outIP, uint32_t& outPort)
{
	if (addr == NULL)
		return 0;

	std::string strip;
	uint32_t addrlen = 0;
	uint32_t port = 0;

	if (addr->sa_family == AF_INET6)
	{
		addrlen = sizeof(struct sockaddr_in6);

		const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) addr;

		char szIp[NET_UV_INET6_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip6_name(addr_in, szIp, NET_UV_INET6_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin6_port);
	}
	else
	{
		addrlen = sizeof(struct sockaddr_in);

		const struct sockaddr_in* addr_in = (const struct sockaddr_in*) addr;

		char szIp[NET_UV_INET_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip4_name(addr_in, szIp, NET_UV_INET_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin_port);
	}

	outIP = strip;
	outPort = port;

	return addrlen;
}